

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestDriver.cpp
# Opt level: O2

void SimulateShadowAgainstBarbarian(void)

{
  bool bVar1;
  Character *char1;
  Character *char2;
  ostream *poVar2;
  char *pcVar3;
  
  char1 = (Character *)operator_new(0x60);
  Shadow::Shadow((Shadow *)char1);
  char2 = (Character *)operator_new(0x60);
  Barbarian::Barbarian((Barbarian *)char2);
  bVar1 = sim(char1,char2,1000000,1.0);
  pcVar3 = "failed!";
  if (bVar1) {
    pcVar3 = "Passed!";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  Shadow::~Shadow((Shadow *)char1);
  operator_delete(char1);
  Barbarian::~Barbarian((Barbarian *)char2);
  operator_delete(char2);
  return;
}

Assistant:

void SimulateShadowAgainstBarbarian()
{
    bool passed;

    Shadow *shadow = new Shadow();
    Barbarian *barb = new Barbarian();
    passed = sim(shadow, barb, NUM_TEST_RUNS, 1.0);
    if(passed)
    {
        std::cout << "Passed!" << std::endl;
    }
    else
    {
        std::cout << "failed!" << std::endl;
    }
    delete shadow;
    delete barb;
}